

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type * __thiscall
FadBinaryPow<Fad<Fad<double>_>,_Fad<Fad<double>_>_>::val
          (value_type *__return_storage_ptr__,
          FadBinaryPow<Fad<Fad<double>_>,_Fad<Fad<double>_>_> *this)

{
  uint uVar1;
  Fad<double> *pFVar2;
  Fad<double> *pFVar3;
  uint uVar4;
  double *pdVar5;
  ulong uVar6;
  double dVar7;
  value_type vVar8;
  FadBinaryPow<Fad<double>,_Fad<double>_> local_38;
  
  local_38.left_ = &this->left_->val_;
  local_38.right_ = &this->right_->val_;
  dVar7 = pow((this->left_->val_).val_,(this->right_->val_).val_);
  pFVar3 = local_38.right_;
  pFVar2 = local_38.left_;
  __return_storage_ptr__->val_ = dVar7;
  uVar1 = ((local_38.left_)->dx_).num_elts;
  uVar4 = ((local_38.right_)->dx_).num_elts;
  if ((int)uVar4 < (int)uVar1) {
    uVar4 = uVar1;
  }
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  if (0 < (int)uVar4) {
    (__return_storage_ptr__->dx_).num_elts = uVar4;
    pdVar5 = (double *)operator_new__((ulong)uVar4 << 3);
    (__return_storage_ptr__->dx_).ptr_to_data = pdVar5;
  }
  __return_storage_ptr__->defaultVal = 0.0;
  uVar1 = (pFVar2->dx_).num_elts;
  uVar4 = (pFVar3->dx_).num_elts;
  if ((int)uVar4 < (int)uVar1) {
    uVar4 = uVar1;
  }
  if (0 < (int)uVar4) {
    pdVar5 = (__return_storage_ptr__->dx_).ptr_to_data;
    uVar6 = 0;
    do {
      vVar8 = FadBinaryPow<Fad<double>,_Fad<double>_>::dx(&local_38,(int)uVar6);
      pdVar5[uVar6] = vVar8;
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

const value_type val() const {return pow( left_.val(), right_.val() );}